

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O1

CURLcode Curl_cf_haproxy_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode CVar1;
  undefined4 *ctx;
  undefined4 *puVar2;
  Curl_cfilter *cf;
  Curl_cfilter *local_28;
  
  local_28 = (Curl_cfilter *)0x0;
  ctx = (undefined4 *)(*Curl_ccalloc)(1,0x28);
  if (ctx == (undefined4 *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
    puVar2 = (undefined4 *)0x0;
  }
  else {
    *ctx = 0;
    Curl_dyn_init((dynbuf *)(ctx + 2),0x800);
    CVar1 = Curl_cf_create(&local_28,&Curl_cft_haproxy,ctx);
    puVar2 = (undefined4 *)0x0;
    if (CVar1 != CURLE_OK) {
      puVar2 = ctx;
    }
  }
  if (puVar2 != (undefined4 *)0x0) {
    Curl_dyn_free((dynbuf *)(puVar2 + 2));
    (*Curl_cfree)(puVar2);
  }
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_insert_after(cf_at,local_28);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_haproxy_insert_after(struct Curl_cfilter *cf_at,
                                      struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_haproxy_create(&cf, data);
  if(result)
    goto out;
  Curl_conn_cf_insert_after(cf_at, cf);

out:
  return result;
}